

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsizegrip.cpp
# Opt level: O3

void QSizeGrip::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  QSizeGripPrivate::_q_showIfNotHidden(*(QSizeGripPrivate **)(_o + 8));
  return;
}

Assistant:

void QSizeGrip::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSizeGrip *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_showIfNotHidden(); break;
        default: ;
        }
    }
    (void)_a;
}